

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_monte_carlo.cpp
# Opt level: O3

double line01_monomial_integral(int e)

{
  if (e != -1) {
    return 1.0 / (double)(e + 1);
  }
  std::operator<<((ostream *)&std::cout,"\n");
  std::operator<<((ostream *)&std::cout,"LINE01_MONOMIAL_INTEGRAL - Fatal error!\n");
  std::operator<<((ostream *)&std::cout,"  E = -1.\n");
  exit(1);
}

Assistant:

double line01_monomial_integral ( int e )

//****************************************************************************80
//
//  Purpose:
//
//    LINE01_MONOMIAL_INTEGRAL returns monomial integrals on the unit line.
//
//  Discussion:
//
//    The integration region is 
//
//      0 <= X <= 1.
//
//    The monomial is F(X) = X^E.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    17 January 2014
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Philip Davis, Philip Rabinowitz,
//    Methods of Numerical Integration,
//    Second Edition,
//    Academic Press, 1984, page 263.
//
//  Parameters:
//
//    Input, int E, the exponent.  E must be nonnegative.
//
//    Output, double LINE01_MONOMIAL_INTEGRAL, the integral.
//
{
  double integral;

  if ( e == -1 )
  {
    std::cout << "\n";
    std::cout << "LINE01_MONOMIAL_INTEGRAL - Fatal error!\n";
    std::cout << "  E = -1.\n";
    exit ( 1 );
  }

  integral = 1.0 / double( e + 1 );

  return integral;
}